

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O2

void __thiscall QMYSQLResult::cleanup(QMYSQLResult *this,EVP_PKEY_CTX *ctx)

{
  QMYSQLResultPrivate *this_00;
  QMyField *pQVar1;
  void *pvVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  QMYSQLDriverPrivate *pQVar6;
  MYSQL_RES *pMVar7;
  long lVar8;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMYSQLResultPrivate **)&this->field_0x8;
  pMVar7 = this_00->result;
  while( true ) {
    if (pMVar7 != (MYSQL_RES *)0x0) {
      mysql_free_result(pMVar7);
    }
    lVar5 = QSqlResult::driver();
    if (lVar5 == 0) break;
    pQVar6 = QMYSQLResultPrivate::drv_d_func(this_00);
    if (pQVar6->mysql == (MYSQL *)0x0) break;
    pQVar6 = QMYSQLResultPrivate::drv_d_func(this_00);
    iVar4 = mysql_next_result(pQVar6->mysql);
    if (iVar4 != 0) break;
    pQVar6 = QMYSQLResultPrivate::drv_d_func(this_00);
    pMVar7 = (MYSQL_RES *)mysql_store_result(pQVar6->mysql);
  }
  if (this_00->stmt != (MYSQL_STMT *)0x0) {
    cVar3 = mysql_stmt_close();
    if (cVar3 != '\0') {
      lcMysql();
      if (((byte)lcMysql::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
        local_58[0] = '\x02';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = '\0';
        local_58[4] = '\0';
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        local_58[0x10] = '\0';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        local_40 = lcMysql::category.name;
        QMessageLogger::warning(local_58,"QMYSQLResult::cleanup: unable to free statement handle");
      }
    }
    this_00->stmt = (MYSQL_STMT *)0x0;
  }
  if (this_00->meta != (MYSQL_RES *)0x0) {
    mysql_free_result();
    this_00->meta = (MYSQL_RES *)0x0;
  }
  pQVar1 = (this_00->fields).d.ptr;
  lVar5 = (this_00->fields).d.size;
  for (lVar8 = 0; lVar5 * 0x28 - lVar8 != 0; lVar8 = lVar8 + 0x28) {
    pvVar2 = *(void **)((long)&pQVar1->outField + lVar8);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
  }
  if (this_00->outBinds != (MYSQL_BIND *)0x0) {
    operator_delete__(this_00->outBinds);
    this_00->outBinds = (MYSQL_BIND *)0x0;
  }
  if (this_00->inBinds != (MYSQL_BIND *)0x0) {
    operator_delete__(this_00->inBinds);
    this_00->inBinds = (MYSQL_BIND *)0x0;
  }
  this_00->hasBlobs = false;
  QList<QMYSQLResultPrivate::QMyField>::clear(&this_00->fields);
  this_00->result = (MYSQL_RES *)0x0;
  this_00->row = (MYSQL_ROW)0x0;
  (**(code **)(*(long *)this + 0x18))(this,0xffffffffffffffff);
  (**(code **)(*(long *)this + 0x20))(this,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMYSQLResult::cleanup()
{
    Q_D(QMYSQLResult);
    if (d->result)
        mysql_free_result(d->result);

// must iterate through leftover result sets from multi-selects or stored procedures
// if this isn't done subsequent queries will fail with "Commands out of sync"
    while (driver() && d->drv_d_func()->mysql && mysql_next_result(d->drv_d_func()->mysql) == 0) {
        MYSQL_RES *res = mysql_store_result(d->drv_d_func()->mysql);
        if (res)
            mysql_free_result(res);
    }

    if (d->stmt) {
        if (mysql_stmt_close(d->stmt))
            qCWarning(lcMysql, "QMYSQLResult::cleanup: unable to free statement handle");
        d->stmt = 0;
    }

    if (d->meta) {
        mysql_free_result(d->meta);
        d->meta = 0;
    }

    for (const QMYSQLResultPrivate::QMyField &f : std::as_const(d->fields))
        delete[] f.outField;

    if (d->outBinds) {
        delete[] d->outBinds;
        d->outBinds = 0;
    }

    if (d->inBinds) {
        delete[] d->inBinds;
        d->inBinds = 0;
    }

    d->hasBlobs = false;
    d->fields.clear();
    d->result = nullptr;
    d->row = nullptr;
    setAt(-1);
    setActive(false);
}